

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O2

void __thiscall cmInstallTargetGenerator::GenerateScript(cmInstallTargetGenerator *this,ostream *os)

{
  cmTarget *this_00;
  bool bVar1;
  ostream *poVar2;
  ostringstream msg;
  char *local_1b8 [4];
  string local_198 [11];
  
  this_00 = this->Target;
  std::__cxx11::string::string((string *)local_198,"EXCLUDE_FROM_ALL",(allocator *)local_1b8);
  bVar1 = cmTarget::GetPropertyAsBool(this_00,local_198);
  std::__cxx11::string::~string((string *)local_198);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    poVar2 = std::operator<<((ostream *)local_198,"WARNING: Target \"");
    poVar2 = std::operator<<(poVar2,(string *)&this->Target->Name);
    poVar2 = std::operator<<(poVar2,"\" has EXCLUDE_FROM_ALL set and will not be built by default ")
    ;
    poVar2 = std::operator<<(poVar2,"but an install rule has been provided for it.  CMake does ");
    std::operator<<(poVar2,"not define behavior for this case.");
    std::__cxx11::stringbuf::str();
    cmSystemTools::Message(local_1b8[0],"Warning");
    std::__cxx11::string::~string((string *)local_1b8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  }
  cmInstallGenerator::GenerateScript(&this->super_cmInstallGenerator,os);
  return;
}

Assistant:

void cmInstallTargetGenerator::GenerateScript(std::ostream& os)
{
  // Warn if installing an exclude-from-all target.
  if(this->Target->GetPropertyAsBool("EXCLUDE_FROM_ALL"))
    {
    std::ostringstream msg;
    msg << "WARNING: Target \"" << this->Target->GetName()
        << "\" has EXCLUDE_FROM_ALL set and will not be built by default "
        << "but an install rule has been provided for it.  CMake does "
        << "not define behavior for this case.";
    cmSystemTools::Message(msg.str().c_str(), "Warning");
    }

  // Perform the main install script generation.
  this->cmInstallGenerator::GenerateScript(os);
}